

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# raft_server.hxx
# Opt level: O2

limits * __thiscall nuraft::raft_server::limits::operator=(limits *this,limits *src)

{
  LOCK();
  (this->pre_vote_rejection_limit_).super___atomic_base<int>._M_i =
       (src->pre_vote_rejection_limit_).super___atomic_base<int>._M_i;
  UNLOCK();
  LOCK();
  (this->warning_limit_).super___atomic_base<int>._M_i =
       (src->warning_limit_).super___atomic_base<int>._M_i;
  UNLOCK();
  LOCK();
  (this->response_limit_).super___atomic_base<int>._M_i =
       (src->response_limit_).super___atomic_base<int>._M_i;
  UNLOCK();
  LOCK();
  (this->leadership_limit_).super___atomic_base<int>._M_i =
       (src->leadership_limit_).super___atomic_base<int>._M_i;
  UNLOCK();
  LOCK();
  (this->reconnect_limit_).super___atomic_base<int>._M_i =
       (src->reconnect_limit_).super___atomic_base<int>._M_i;
  UNLOCK();
  LOCK();
  (this->leave_limit_).super___atomic_base<int>._M_i =
       (src->leave_limit_).super___atomic_base<int>._M_i;
  UNLOCK();
  LOCK();
  (this->vote_limit_).super___atomic_base<int>._M_i =
       (src->vote_limit_).super___atomic_base<int>._M_i;
  UNLOCK();
  return this;
}

Assistant:

limits& operator=(const limits& src) {
            pre_vote_rejection_limit_ = src.pre_vote_rejection_limit_.load();
            warning_limit_ = src.warning_limit_.load();
            response_limit_ = src.response_limit_.load();
            leadership_limit_  = src.leadership_limit_.load();
            reconnect_limit_ = src.reconnect_limit_.load();
            leave_limit_ = src.leave_limit_.load();
            vote_limit_ = src.vote_limit_.load();
            return *this;
        }